

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssignmentPatternExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssignmentPatternExpressionSyntax,slang::syntax::DataTypeSyntax*&,slang::syntax::AssignmentPatternSyntax&>
          (BumpAllocator *this,DataTypeSyntax **args,AssignmentPatternSyntax *args_1)

{
  AssignmentPatternExpressionSyntax *pattern;
  DataTypeSyntax *in_RDX;
  AssignmentPatternExpressionSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  pattern = (AssignmentPatternExpressionSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::AssignmentPatternExpressionSyntax::AssignmentPatternExpressionSyntax
            (in_RSI,in_RDX,(AssignmentPatternSyntax *)pattern);
  return pattern;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }